

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall SGParser::Generator::RegExprDFAParseElement::Destroy(RegExprDFAParseElement *this)

{
  ulong uVar1;
  RegExprDFANode *this_00;
  
  if (this->DataType == Node) {
    this_00 = (this->field_1).pNode;
    if (this_00 != (RegExprDFANode *)0x0) {
      RegExprDFANode::~RegExprDFANode(this_00);
    }
    uVar1 = 0x80;
  }
  else {
    if (this->DataType != Chars) goto LAB_00138d6b;
    this_00 = (RegExprDFANode *)(this->field_1).pChars;
    if (this_00 != (RegExprDFANode *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    }
    uVar1 = 0x18;
  }
  operator_delete(this_00,uVar1);
LAB_00138d6b:
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Chars: delete pChars; break;
            case RegExprDataType::Node:  delete pNode;  break;
            default:                                    break;
        }
        DataType = RegExprDataType::Null;
    }